

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O1

FTexture * PNGTexture_CreateFromFile(PNGHandle *png,FString *filename)

{
  FileReader *pFVar1;
  uint uVar2;
  FPNGTexture *this;
  BYTE colortype;
  BYTE bitdepth;
  BYTE interlace;
  BYTE filter;
  BYTE compression;
  DWORD height;
  DWORD width;
  
  uVar2 = M_FindPNGChunk(png,0x52444849);
  if (uVar2 != 0) {
    (*(png->File->super_FileReaderBase)._vptr_FileReaderBase[2])(png->File,&width,4);
    (*(png->File->super_FileReaderBase)._vptr_FileReaderBase[2])(png->File,&height,4);
    pFVar1 = png->File;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,&bitdepth,1);
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,&colortype,1);
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,&compression,1);
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,&filter,1);
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,&interlace,1);
    if (((interlace < 2 && (filter == '\0' && compression == '\0')) &&
        ((0x5dU >> (colortype & 0x1f) & 1) != 0)) && ((0x116U >> (bitdepth & 0x1f) & 1) != 0)) {
      this = (FPNGTexture *)operator_new(0xd0);
      FPNGTexture::FPNGTexture
                (this,png->File,-1,filename,
                 width >> 0x18 | (width & 0xff0000) >> 8 | (width & 0xff00) << 8 | width << 0x18,
                 height >> 0x18 | (height & 0xff0000) >> 8 | (height & 0xff00) << 8 | height << 0x18
                 ,bitdepth,colortype,interlace);
      return &this->super_FTexture;
    }
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *PNGTexture_CreateFromFile(PNGHandle *png, const FString &filename)
{
	DWORD width, height;
	BYTE bitdepth, colortype, compression, filter, interlace;

	if (M_FindPNGChunk(png, MAKE_ID('I','H','D','R')) == 0)
	{
		return NULL;
	}

	// Check the IHDR to make sure it's a type of PNG we support.
	png->File->Read(&width, 4);
	png->File->Read(&height, 4);
	(*png->File) >> bitdepth >> colortype >> compression >> filter >> interlace;

	if (compression != 0 || filter != 0 || interlace > 1)
	{
		return NULL;
	}
	if (!((1 << colortype) & 0x5D))
	{
		return NULL;
	}
	if (!((1 << bitdepth) & 0x116))
	{
		return NULL;
	}

	return new FPNGTexture (*png->File, -1, filename, BigLong((int)width), BigLong((int)height),
		bitdepth, colortype, interlace);
}